

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SPIREntryPoint * __thiscall
spirv_cross::Compiler::get_entry_point(Compiler *this,string *name,ExecutionModel model)

{
  anon_class_16_2_f7d58dc9_for__M_pred __pred;
  bool bVar1;
  CompilerError *this_00;
  pointer pvVar2;
  allocator local_71;
  string local_70 [32];
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_50;
  string *local_48;
  ExecutionModel *local_40;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_28;
  _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
  itr;
  ExecutionModel model_local;
  string *name_local;
  Compiler *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  ._M_cur._4_4_ = model;
  local_30._M_cur =
       (__node_type *)
       ::std::
       begin<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  local_38._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  local_40 = (ExecutionModel *)
             ((long)&itr.
                     super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                     ._M_cur + 4);
  __pred.model = local_40;
  __pred.name = name;
  local_48 = name;
  local_28._M_cur =
       (__node_type *)
       ::std::
       find_if<std::__detail::_Node_const_iterator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,false,true>,spirv_cross::Compiler::get_entry_point(std::__cxx11::string_const&,spv::ExecutionModel)const::__0>
                 (local_30._M_cur,
                  (_Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
                   )local_38._M_cur,__pred);
  local_50._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>>
                 (&(this->ir).entry_points);
  bVar1 = ::std::__detail::operator==(&local_28,&local_50);
  if (!bVar1) {
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
                           *)&local_28);
    return &pvVar2->second;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_70,"Entry point does not exist.",&local_71);
  CompilerError::CompilerError(this_00,(string *)local_70);
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

const SPIREntryPoint &Compiler::get_entry_point(const std::string &name, ExecutionModel model) const
{
	auto itr = find_if(begin(ir.entry_points), end(ir.entry_points),
	                   [&](const std::pair<uint32_t, SPIREntryPoint> &entry) -> bool {
		                   return entry.second.orig_name == name && entry.second.model == model;
	                   });

	if (itr == end(ir.entry_points))
		SPIRV_CROSS_THROW("Entry point does not exist.");

	return itr->second;
}